

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameworld.cpp
# Opt level: O1

void __thiscall CGameWorld::Reset(CGameWorld *this)

{
  CEntity *pCVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    pCVar1 = this->m_apFirstEntityTypes[lVar2];
    while (pCVar1 != (CEntity *)0x0) {
      this->m_pNextTraverseEntity = pCVar1->m_pNextTypeEntity;
      (*pCVar1->_vptr_CEntity[3])();
      pCVar1 = this->m_pNextTraverseEntity;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  RemoveEntities(this);
  IGameController::OnReset(this->m_pGameServer->m_pController);
  RemoveEntities(this);
  this->m_ResetRequested = false;
  return;
}

Assistant:

void CGameWorld::Reset()
{
	// reset all entities
	for(int i = 0; i < NUM_ENTTYPES; i++)
		for(CEntity *pEnt = m_apFirstEntityTypes[i]; pEnt; )
		{
			m_pNextTraverseEntity = pEnt->m_pNextTypeEntity;
			pEnt->Reset();
			pEnt = m_pNextTraverseEntity;
		}
	RemoveEntities();

	GameServer()->m_pController->OnReset();
	RemoveEntities();

	m_ResetRequested = false;
}